

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

bool __thiscall clickhouse::Client::Impl::ReceiveHello(Impl *this)

{
  CodedInputStream *this_00;
  uint64_t *value;
  bool bVar1;
  ulong uVar2;
  uint64_t packet_type;
  
  packet_type = 0;
  this_00 = &this->input_;
  bVar1 = CodedInputStream::ReadVarint64(this_00,&packet_type);
  if (!bVar1) {
    return false;
  }
  if (packet_type == 2) {
    ReceiveException(this,true);
    return false;
  }
  if (packet_type != 0) {
    return false;
  }
  bVar1 = WireFormat::ReadString(this_00,&(this->server_info_).name);
  if (bVar1) {
    bVar1 = CodedInputStream::ReadVarint64(this_00,&(this->server_info_).version_major);
    if (!bVar1) {
      return false;
    }
    bVar1 = CodedInputStream::ReadVarint64(this_00,&(this->server_info_).version_minor);
    if (!bVar1) {
      return false;
    }
    value = &(this->server_info_).revision;
    bVar1 = CodedInputStream::ReadVarint64(this_00,value);
    if (!bVar1) {
      return false;
    }
    uVar2 = *value;
    if (0xd329 < uVar2) {
      bVar1 = WireFormat::ReadString(this_00,&(this->server_info_).timezone);
      if (!bVar1) {
        return false;
      }
      uVar2 = *value;
      if (0xd463 < uVar2) {
        bVar1 = WireFormat::ReadString(this_00,&(this->server_info_).display_name);
        if (!bVar1) {
          return false;
        }
        uVar2 = *value;
        if (0xd480 < uVar2) {
          bVar1 = CodedInputStream::ReadVarint64(this_00,&(this->server_info_).version_patch);
          if (bVar1) {
            return true;
          }
          return false;
        }
      }
    }
    (this->server_info_).version_patch = uVar2;
    return true;
  }
  return false;
}

Assistant:

bool Client::Impl::ReceiveHello() {
    uint64_t packet_type = 0;

    if (!input_.ReadVarint64(&packet_type)) {
        return false;
    }

    if (packet_type == ServerCodes::Hello) {
        if (!WireFormat::ReadString(&input_, &server_info_.name)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.version_major)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.version_minor)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.revision)) {
            return false;
        }

        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_SERVER_TIMEZONE) {
            if (!WireFormat::ReadString(&input_, &server_info_.timezone)) {
                return false;
            }
        }
        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_SERVER_DISPLAY_NAME) {
            if (!WireFormat::ReadString(&input_, &server_info_.display_name)) {
                return false;
            }
        }
        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_VERSION_PATCH) {
            if (!WireFormat::ReadUInt64(&input_, &server_info_.version_patch)) {
                return false;
            }
        } else {
            server_info_.version_patch = server_info_.revision;
        }

        return true;
    } else if (packet_type == ServerCodes::Exception) {
        ReceiveException(true);
        return false;
    }

    return false;
}